

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBase *
CreateFunctionCall0(ExpressionContext *ctx,SynBase *source,InplaceStr name,bool allowFailure,
                   bool allowInternal,bool allowFastLookup)

{
  ExprBase *pEVar1;
  ArrayView<ArgumentData> arguments_00;
  SmallArray<ArgumentData,_1U> arguments;
  
  arguments.allocator = ctx->allocator;
  arguments.data = arguments.little;
  arguments.little[0].source = (SynBase *)0x0;
  arguments.little[0].isExplicit = false;
  arguments.little[0].name = (SynIdentifier *)0x0;
  arguments.little[0].type = (TypeBase *)0x0;
  arguments.little[0].value = (ExprBase *)0x0;
  arguments.little[0].valueFunction = (FunctionData *)0x0;
  arguments.count = 0;
  arguments.max = 1;
  arguments_00._8_8_ = 0;
  arguments_00.data = arguments.data;
  pEVar1 = CreateFunctionCallByName
                     (ctx,source,name,arguments_00,allowFailure,allowInternal,allowFastLookup);
  SmallArray<ArgumentData,_1U>::~SmallArray(&arguments);
  return pEVar1;
}

Assistant:

ExprBase* CreateFunctionCall0(ExpressionContext &ctx, SynBase *source, InplaceStr name, bool allowFailure, bool allowInternal, bool allowFastLookup)
{
	SmallArray<ArgumentData, 1> arguments(ctx.allocator);

	return CreateFunctionCallByName(ctx, source, name, arguments, allowFailure, allowInternal, allowFastLookup);
}